

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O0

int __thiscall List::printPageByNum(List *this,int currIndex)

{
  ostream *this_00;
  int local_20;
  int local_1c;
  int pageNumber;
  int currIndex_local;
  List *this_local;
  
  local_1c = currIndex;
  _pageNumber = this;
  std::operator<<((ostream *)&std::cout,"Enter page number: ");
  std::istream::operator>>((istream *)&std::cin,&local_20);
  CheckCin();
  if ((local_20 < 1) || (this->m_listSize / this->m_pageSize < local_20)) {
    this_00 = std::operator<<((ostream *)&std::cout,
                              "It is impossible to read a page with that number!");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    this_local._4_4_ = local_1c;
  }
  else {
    local_1c = (local_20 + -1) * this->m_pageSize;
    this_local._4_4_ = printPage(this,local_1c);
  }
  return this_local._4_4_;
}

Assistant:

int printPageByNum(int currIndex) {
        cout << "Enter page number: ";
        int pageNumber;
        cin >> pageNumber;
        CheckCin();
        if (pageNumber <= 0 || pageNumber > m_listSize / m_pageSize) {
            cout << "It is impossible to read a page with that number!" << endl;
            return currIndex;
        } else {
            currIndex = (pageNumber - 1) * m_pageSize;
            currIndex = printPage(currIndex);
        }
        return currIndex;
    }